

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_FieldContextParentFieldsTest_Test::
~MessageDifferencerTest_FieldContextParentFieldsTest_Test
          (MessageDifferencerTest_FieldContextParentFieldsTest_Test *this)

{
  MessageDifferencerTest_FieldContextParentFieldsTest_Test *this_local;
  
  ~MessageDifferencerTest_FieldContextParentFieldsTest_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MessageDifferencerTest, FieldContextParentFieldsTest) {
  proto2_unittest::TestDiffMessage msg1;
  msg1.add_rm()->set_c(1);
  proto2_unittest::TestDiffMessage msg2;
  msg2.add_rm()->set_c(1);

  ParentSavingFieldComparator field_comparator;
  util::MessageDifferencer differencer;
  differencer.set_field_comparator(&field_comparator);
  differencer.Compare(msg1, msg2);

  // We want only one parent with the name "rm"
  ASSERT_EQ(1, field_comparator.parent_fields().size());
  EXPECT_EQ("rm", field_comparator.parent_fields()[0].field->name());
}